

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

double __thiscall NEST::LArNEST::GetAlphaPhotonYields(LArNEST *this,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = (this->fAlpha).Yph.A;
  dVar5 = pow(efield,(this->fAlpha).Yph.B);
  dVar2 = (this->fAlpha).Yph.H;
  dVar3 = (this->fAlpha).Yph.I;
  dVar6 = pow(efield / (this->fAlpha).Yph.J,(this->fAlpha).Yph.K);
  dVar7 = pow(dVar6 + dVar3,(this->fAlpha).Yph.L);
  dVar7 = dVar7 * dVar2;
  dVar2 = (this->fAlpha).Yph.C;
  dVar3 = (this->fAlpha).Yph.D;
  dVar9 = dVar3 / (this->fAlpha).Yph.F;
  dVar6 = (this->fAlpha).Yph.G;
  dVar4 = (this->fAlpha).Yph.E;
  dVar8 = log((dVar7 / (this->fAlpha).Yph.M) * dVar9 + 1.0);
  return ((1.0 - (dVar8 * dVar6) / (((this->fAlpha).Yph.D / (this->fAlpha).Yph.F) * dVar7)) * dVar9
         + dVar3 * dVar4) * (1.0 / (dVar5 * dVar1)) * dVar2;
}

Assistant:

double LArNEST::GetAlphaPhotonYields(double efield) {
  double quench = 1.0 / (fAlpha.Yph.A * pow(efield, fAlpha.Yph.B));
  double fieldTerm =
      fAlpha.Yph.H *
      pow((fAlpha.Yph.I + pow((efield / fAlpha.Yph.J), fAlpha.Yph.K)),
          fAlpha.Yph.L);
  return quench * fAlpha.Yph.C *
         (fAlpha.Yph.D * fAlpha.Yph.E +
          (fAlpha.Yph.D / fAlpha.Yph.F) *
              (1 - (fAlpha.Yph.G *
                    log(1 + (fAlpha.Yph.D / fAlpha.Yph.F) *
                                (fieldTerm / fAlpha.Yph.M)) /
                    ((fAlpha.Yph.D / fAlpha.Yph.F) * fieldTerm))));
}